

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O0

void __thiscall kws::Generator::ReadConfigurationFile(Generator *this,char *configFile)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  long in_RDI;
  XMLReader reader;
  XMLReader *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc20;
  allocator *paVar3;
  XMLReader *in_stack_fffffffffffffc28;
  string *this_00;
  allocator local_3a9;
  string local_3a8 [24];
  string *in_stack_fffffffffffffc70;
  XMLReader *in_stack_fffffffffffffc78;
  allocator local_361;
  string local_360 [32];
  string local_340 [39];
  allocator local_319;
  string local_318 [32];
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  string local_2b0 [688];
  
  XMLReader::XMLReader(in_stack_fffffffffffffc00);
  bVar1 = XMLReader::Open(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"Project",&local_2d1);
    XMLReader::GetValue(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    this_00 = local_2b0;
    std::__cxx11::string::operator=((string *)(in_RDI + 8),this_00);
    std::__cxx11::string::~string(this_00);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_318,"ProjectLogo",&local_319);
    XMLReader::GetValue(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_2f8);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    paVar3 = &local_361;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"KWStyleLogo",paVar3);
    XMLReader::GetValue(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x48),local_340);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,"ErrorThreshold",&local_3a9);
    XMLReader::GetValue(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    in_stack_fffffffffffffc00 = (XMLReader *)&stack0xfffffffffffffc78;
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    *(int *)(in_RDI + 0x6c) = iVar2;
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffc00);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    XMLReader::Close((XMLReader *)0x18c3de);
  }
  XMLReader::~XMLReader(in_stack_fffffffffffffc00);
  return;
}

Assistant:

void Generator::ReadConfigurationFile(const char* configFile)
{
  kws::XMLReader reader;
  if(reader.Open(configFile))
    {
    m_ProjectTitle = reader.GetValue("Project");
    m_ProjectLogo = reader.GetValue("ProjectLogo");
    m_KWStyleLogo = reader.GetValue("KWStyleLogo");
    m_ErrorThreshold = atoi(reader.GetValue("ErrorThreshold").c_str());
    reader.Close();
    }
}